

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.hpp
# Opt level: O0

void __thiscall mraa::Iio::Iio(Iio *this,string *deviceName)

{
  undefined8 uVar1;
  ostream *poVar2;
  invalid_argument *piVar3;
  mraa_iio_context p_Var4;
  string local_1f0 [39];
  undefined1 local_1c9;
  string local_1c8 [52];
  int local_194;
  ostringstream local_190 [4];
  int id;
  ostringstream oss;
  string *deviceName_local;
  Iio *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  uVar1 = std::__cxx11::string::c_str();
  local_194 = mraa_iio_get_device_num_by_name(uVar1);
  if (local_194 == -1) {
    poVar2 = std::operator<<((ostream *)local_190,"IIO device name ");
    poVar2 = std::operator<<(poVar2,(string *)deviceName);
    std::operator<<(poVar2," not found");
    local_1c9 = 1;
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(piVar3,local_1c8);
    local_1c9 = 0;
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  p_Var4 = (mraa_iio_context)mraa_iio_init(local_194);
  this->m_iio = p_Var4;
  if (this->m_iio == (mraa_iio_context)0x0) {
    poVar2 = std::operator<<((ostream *)local_190,"IIO device ");
    poVar2 = std::operator<<(poVar2,(string *)deviceName);
    std::operator<<(poVar2," is not valid");
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(piVar3,local_1f0);
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

Iio(const std::string& deviceName)
    {
        std::ostringstream oss;
        int id = mraa_iio_get_device_num_by_name(deviceName.c_str());
        if (id == -1) {
            oss << "IIO device name " << deviceName << " not found";
            throw std::invalid_argument(oss.str());
        }
        m_iio = mraa_iio_init(id);
        if (m_iio == NULL) {
            oss << "IIO device " << deviceName << " is not valid";
            throw std::invalid_argument(oss.str());
        }
    }